

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl_bio.c
# Opt level: O3

int amqp_openssl_bio_should_retry(int res)

{
  int iVar1;
  
  if (res == -1) {
    iVar1 = amqp_os_socket_error();
    if ((iVar1 - 0x47U < 0x2d) && ((0x181000000001U >> ((ulong)(iVar1 - 0x47U) & 0x3f) & 1) != 0)) {
      return 1;
    }
    if (iVar1 == 4) {
      return 1;
    }
    if (iVar1 == 0xb) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int amqp_openssl_bio_should_retry(int res) {
  if (res == -1) {
    int err = amqp_os_socket_error();
    if (
#ifdef EWOULDBLOCK
        err == EWOULDBLOCK ||
#endif
#ifdef WSAEWOULDBLOCK
        err == WSAEWOULDBLOCK ||
#endif
#ifdef ENOTCONN
        err == ENOTCONN ||
#endif
#ifdef EINTR
        err == EINTR ||
#endif
#ifdef EAGAIN
        err == EAGAIN ||
#endif
#ifdef EPROTO
        err == EPROTO ||
#endif
#ifdef EINPROGRESS
        err == EINPROGRESS ||
#endif
#ifdef EALREADY
        err == EALREADY ||
#endif
        0) {
      return 1;
    }
  }
  return 0;
}